

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool SQVM::IsEqual(SQObjectPtr *o1,SQObjectPtr *o2,bool *res)

{
  SQObjectType SVar1;
  SQObjectType SVar2;
  bool bVar3;
  SQFloat SVar4;
  SQFloat SVar5;
  
  SVar1 = (o1->super_SQObject)._type;
  SVar2 = (o2->super_SQObject)._type;
  if (SVar1 == SVar2) {
    bVar3 = (o1->super_SQObject)._unVal.pTable == (o2->super_SQObject)._unVal.pTable;
  }
  else if (((SVar1 & SVar2) >> 0x1a & 1) == 0) {
    bVar3 = false;
  }
  else {
    if (SVar1 == OT_INTEGER) {
      SVar4 = (SQFloat)(o1->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar4 = (o1->super_SQObject)._unVal.fFloat;
    }
    if (SVar2 == OT_INTEGER) {
      SVar5 = (SQFloat)(o2->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar5 = (o2->super_SQObject)._unVal.fFloat;
    }
    bVar3 = (bool)(-(SVar4 == SVar5) & 1);
  }
  *res = bVar3;
  return true;
}

Assistant:

bool SQVM::IsEqual(const SQObjectPtr &o1,const SQObjectPtr &o2,bool &res)
{
    if(type(o1) == type(o2)) {
        res = (_rawval(o1) == _rawval(o2));
    }
    else {
        if(sq_isnumeric(o1) && sq_isnumeric(o2)) {
            res = (tofloat(o1) == tofloat(o2));
        }
        else {
            res = false;
        }
    }
    return true;
}